

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

void __thiscall
cs::compiler_type::build_ast
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast,charset encoding)

{
  undefined4 in_ECX;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tmp;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_00000120;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000128;
  compiler_type *in_stack_00000130;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffff80;
  charset in_stack_ffffffffffffffcc;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffd0;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x4f2b6c);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x4f2b76);
  translate_into_tokens
            ((compiler_type *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  process_token_buff(in_stack_00000130,in_stack_00000128,in_stack_00000120);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffff80)
  ;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffff80)
  ;
  return;
}

Assistant:

void build_ast(const std::deque<char> &buff, std::deque<std::deque<token_base *>> &ast,
		               charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens, tmp;
			translate_into_tokens(buff, tokens, encoding);
			process_token_buff(tokens, ast);
		}